

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arithmetic.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     add<true,unsigned_short,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (modify_t<unsigned_short> destination,read_t<unsigned_short> source,Context *context)

{
  bool bVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  unsigned_short result;
  Context *context_local;
  read_t<unsigned_short> source_local;
  modify_t<unsigned_short> destination_local;
  
  uVar3 = *destination;
  uVar2 = Flags::carry_bit<unsigned_short>(&context->flags);
  uVar2 = uVar3 + source + uVar2;
  bVar1 = Numeric::carried_out<true,15,unsigned_short>(*destination,source,uVar2);
  Flags::set_from<(InstructionSet::x86::Flag)0>(&context->flags,(uint)bVar1);
  bVar1 = Numeric::carried_in<4,unsigned_short>(*destination,source,uVar2);
  Flags::set_from<(InstructionSet::x86::Flag)1>(&context->flags,(uint)bVar1);
  uVar3 = Numeric::overflow<true,unsigned_short>(*destination,source,uVar2);
  Flags::set_from<(InstructionSet::x86::Flag)3>(&context->flags,(uint)uVar3);
  Flags::
  set_from<unsigned_short,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)8>
            (&context->flags,uVar2);
  *destination = uVar2;
  return;
}

Assistant:

void add(
	modify_t<IntT> destination,
	read_t<IntT> source,
	ContextT &context
) {
	/*
		DEST ← DEST + SRC [+ CF];
	*/
	/*
		The OF, SF, ZF, AF, CF, and PF flags are set according to the result.
	*/
	const IntT result = destination + source + (with_carry ? context.flags.template carry_bit<IntT>() : 0);

	context.flags.template set_from<Flag::Carry>(
		Numeric::carried_out<true, Numeric::bit_size<IntT>() - 1>(destination, source, result));
	context.flags.template set_from<Flag::AuxiliaryCarry>(
		Numeric::carried_in<4>(destination, source, result));
	context.flags.template set_from<Flag::Overflow>(
		Numeric::overflow<true, IntT>(destination, source, result));

	context.flags.template set_from<IntT, Flag::Zero, Flag::Sign, Flag::ParityOdd>(result);

	destination = result;
}